

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::sse2::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  PrimRefMB *pPVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  PrimRefMB *pPVar6;
  undefined1 auVar7 [16];
  ulong uVar8;
  ulong uVar9;
  undefined4 uVar10;
  ulong uVar11;
  size_t sVar12;
  size_t *psVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar31;
  float fVar32;
  float fVar33;
  uint uVar38;
  float fVar39;
  undefined1 auVar34 [12];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar37;
  float fVar40;
  undefined1 auVar41 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  undefined1 auVar43 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar44;
  float fVar45;
  undefined1 auVar46 [12];
  undefined1 auVar47 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar48;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar55 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar57;
  float fVar58;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong local_1d0;
  unsigned_long local_1b0;
  size_t local_1a8;
  size_t local_1a0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_198;
  ulong local_110;
  anon_class_16_2_07cfa4d6 local_108;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_f8;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  uVar16 = r->_begin;
  uVar8 = r->_end;
  aVar42 = _DAT_01f7a9f0;
  aVar44 = _DAT_01f7a9f0;
  aVar49 = _DAT_01f7aa00;
  aVar56 = _DAT_01f7aa00;
  aVar57 = _DAT_01f7a9f0;
  if (uVar16 < uVar8) {
    fVar33 = 0.0;
    fVar39 = 1.0;
    fVar50 = 1.0;
    local_1b0 = 0;
    local_198 = _DAT_01f7aa00;
    local_1a8 = 0;
    local_1d0 = 0;
    fVar58 = 0.0;
    local_1a0 = k;
    do {
      BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      fVar32 = BVar3.lower;
      fVar45 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      fVar23 = t0t1->lower;
      fVar24 = t0t1->upper;
      fVar40 = BVar3.upper - fVar32;
      fVar21 = floorf(((fVar23 - fVar32) / fVar40) * 1.0000002 * fVar45);
      fVar22 = ceilf(((fVar24 - fVar32) / fVar40) * 0.99999976 * fVar45);
      uVar17 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar16);
      pBVar4 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      if ((ulong)(uVar17 + 3) < (pBVar4->super_RawBufferView).num) {
        fVar51 = 0.0;
        if (0.0 <= fVar21) {
          fVar51 = fVar21;
        }
        if (fVar45 <= fVar22) {
          fVar22 = fVar45;
        }
        if ((uint)(int)fVar51 <= (uint)(int)fVar22) {
          uVar9 = (ulong)(int)fVar51;
          psVar13 = &pBVar4[uVar9].super_RawBufferView.stride;
          uVar11 = uVar8;
          do {
            pcVar5 = ((RawBufferView *)(psVar13 + -2))->ptr_ofs;
            sVar12 = *psVar13;
            lVar15 = sVar12 * (uVar17 + 1);
            lVar19 = sVar12 * (uVar17 + 2);
            lVar14 = sVar12 * (uVar17 + 3);
            auVar30._4_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar15 + 0xc)));
            auVar30._0_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + sVar12 * uVar17 + 0xc)));
            auVar30._8_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar19 + 0xc)));
            auVar30._12_4_ = -(uint)(1.844e+18 <= ABS(*(float *)(pcVar5 + lVar14 + 0xc)));
            iVar18 = movmskps((int)uVar11,auVar30);
            if (iVar18 != 0) goto LAB_009d408a;
            pfVar1 = (float *)(pcVar5 + sVar12 * uVar17);
            auVar36._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar36._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar36._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar36._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar10 = movmskps(0,auVar36);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_009d408a;
            pfVar1 = (float *)(pcVar5 + lVar15);
            auVar26._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar26._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar26._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar26._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar26);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_009d408a;
            pfVar1 = (float *)(pcVar5 + lVar19);
            auVar27._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar27._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar27._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar27._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar10 = movmskps(CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10),auVar27);
            uVar11 = (ulong)CONCAT31((int3)((uint)uVar10 >> 8),~(byte)uVar10);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_009d408a;
            pfVar1 = (float *)(pcVar5 + lVar14);
            auVar28._0_4_ = -(uint)(-1.844e+18 < *pfVar1 && *pfVar1 < 1.844e+18);
            auVar28._4_4_ = -(uint)(-1.844e+18 < pfVar1[1] && pfVar1[1] < 1.844e+18);
            auVar28._8_4_ = -(uint)(-1.844e+18 < pfVar1[2] && pfVar1[2] < 1.844e+18);
            auVar28._12_4_ = -(uint)(-1.844e+18 < pfVar1[3] && pfVar1[3] < 1.844e+18);
            uVar10 = movmskps((int)pcVar5,auVar28);
            if ((~(byte)uVar10 & 7) != 0) goto LAB_009d408a;
            uVar9 = uVar9 + 1;
            psVar13 = psVar13 + 7;
          } while (uVar9 <= (ulong)(long)(int)fVar22);
        }
        local_108.primID = &local_110;
        fVar21 = (fVar23 - fVar32) / fVar40;
        fVar40 = (fVar24 - fVar32) / fVar40;
        fVar22 = fVar45 * fVar40;
        local_110 = uVar16;
        local_108.this = this;
        fVar23 = floorf(fVar45 * fVar21);
        fVar24 = ceilf(fVar22);
        uVar17 = (uint)fVar23;
        if (fVar23 <= 0.0) {
          fVar23 = 0.0;
        }
        fVar32 = fVar24;
        if (fVar45 <= fVar24) {
          fVar32 = fVar45;
        }
        if ((int)uVar17 < 0) {
          uVar17 = 0xffffffff;
        }
        iVar18 = (int)fVar45 + 1;
        if ((int)fVar24 < (int)fVar45 + 1) {
          iVar18 = (int)fVar24;
        }
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_d8.field_1,&local_108,(long)(int)fVar23);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_f8.field_1,&local_108,(long)(int)fVar32);
        fVar24 = fVar45 * fVar21 - fVar23;
        if (iVar18 - uVar17 == 1) {
          if (fVar24 <= 0.0) {
            fVar24 = 0.0;
          }
          fVar45 = 1.0 - fVar24;
          fVar51 = fVar45 * local_d8.m128[0] + fVar24 * local_f8.m128[0];
          fVar52 = fVar45 * local_d8.m128[1] + fVar24 * local_f8.m128[1];
          fVar53 = fVar45 * local_d8.m128[2] + fVar24 * local_f8.m128[2];
          auVar46._0_4_ = fVar45 * local_c8 + fVar24 * local_e8;
          auVar46._4_4_ = fVar45 * fStack_c4 + fVar24 * fStack_e4;
          auVar46._8_4_ = fVar45 * fStack_c0 + fVar24 * fStack_e0;
          fVar45 = fVar32 - fVar22;
          if (fVar32 - fVar22 <= 0.0) {
            fVar45 = 0.0;
          }
          fVar23 = 1.0 - fVar45;
          auVar25._0_4_ = local_f8.m128[0] * fVar23 + local_d8.m128[0] * fVar45;
          auVar25._4_4_ = local_f8.m128[1] * fVar23 + local_d8.m128[1] * fVar45;
          auVar25._8_4_ = local_f8.m128[2] * fVar23 + local_d8.m128[2] * fVar45;
          auVar34._0_4_ = fVar23 * local_e8 + fVar45 * local_c8;
          auVar34._4_4_ = fVar23 * fStack_e4 + fVar45 * fStack_c4;
          auVar34._8_4_ = fVar23 * fStack_e0 + fVar45 * fStack_c0;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_108,(long)((int)fVar23 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_108,(long)((int)fVar32 + -1));
          if (fVar24 <= 0.0) {
            fVar24 = 0.0;
          }
          fVar23 = 1.0 - fVar24;
          fVar51 = local_d8.m128[0] * fVar23 + local_58.m128[0] * fVar24;
          fVar52 = local_d8.m128[1] * fVar23 + local_58.m128[1] * fVar24;
          fVar53 = local_d8.m128[2] * fVar23 + local_58.m128[2] * fVar24;
          fVar54 = local_d8.m128[3] * fVar23 + local_58.m128[3] * fVar24;
          auVar46._0_4_ = fVar23 * local_c8 + fVar24 * local_48;
          auVar46._4_4_ = fVar23 * fStack_c4 + fVar24 * fStack_44;
          auVar46._8_4_ = fVar23 * fStack_c0 + fVar24 * fStack_40;
          auVar47._12_4_ = fVar23 * fStack_bc + fVar24 * fStack_3c;
          auVar47._0_12_ = auVar46;
          fVar32 = fVar32 - fVar22;
          if (fVar32 <= 0.0) {
            fVar32 = 0.0;
          }
          fVar23 = 1.0 - fVar32;
          auVar55._0_8_ =
               CONCAT44(local_f8.m128[1] * fVar23 + local_78.m128[1] * fVar32,
                        local_f8.m128[0] * fVar23 + local_78.m128[0] * fVar32);
          auVar55._8_4_ = local_f8.m128[2] * fVar23 + local_78.m128[2] * fVar32;
          auVar55._12_4_ = local_f8.m128[3] * fVar23 + local_78.m128[3] * fVar32;
          auVar43._0_8_ =
               CONCAT44(fVar23 * fStack_e4 + fVar32 * fStack_64,
                        fVar23 * local_e8 + fVar32 * local_68);
          auVar43._8_4_ = fVar23 * fStack_e0 + fVar32 * fStack_60;
          auVar43._12_4_ = fVar23 * fStack_dc + fVar32 * fStack_5c;
          if ((int)(uVar17 + 1) < iVar18) {
            sVar12 = (size_t)(uVar17 + 1);
            iVar18 = ~uVar17 + iVar18;
            do {
              fVar23 = ((float)(int)sVar12 / fVar45 - fVar21) / (fVar40 - fVar21);
              fVar24 = 1.0 - fVar23;
              fVar22 = auVar43._12_4_;
              local_a8 = fVar24 * auVar47._0_4_ + fVar23 * auVar43._0_4_;
              fStack_a4 = fVar24 * auVar47._4_4_ + fVar23 * auVar43._4_4_;
              fStack_a0 = fVar24 * auVar47._8_4_ + fVar23 * auVar43._8_4_;
              fStack_9c = fVar24 * auVar47._12_4_ + fVar23 * fVar22;
              _local_b8 = auVar55;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_108,sVar12);
              auVar29._0_4_ = local_98.m128[0] - (fVar51 * fVar24 + auVar55._0_4_ * fVar23);
              auVar29._4_4_ = local_98.m128[1] - (fVar52 * fVar24 + auVar55._4_4_ * fVar23);
              auVar29._8_4_ = local_98.m128[2] - (fVar53 * fVar24 + auVar55._8_4_ * fVar23);
              auVar29._12_4_ = local_98.m128[3] - (fVar54 * fVar24 + auVar55._12_4_ * fVar23);
              auVar35._0_4_ = local_88 - local_a8;
              auVar35._4_4_ = fStack_84 - fStack_a4;
              auVar35._8_4_ = fStack_80 - fStack_a0;
              auVar35._12_4_ = fStack_7c - fStack_9c;
              auVar30 = minps(auVar29,ZEXT816(0));
              auVar36 = maxps(auVar35,ZEXT816(0));
              fVar51 = fVar51 + auVar30._0_4_;
              fVar52 = fVar52 + auVar30._4_4_;
              fVar53 = fVar53 + auVar30._8_4_;
              fVar54 = fVar54 + auVar30._12_4_;
              auVar25._0_8_ =
                   CONCAT44(auVar30._4_4_ + (float)local_b8._4_4_,
                            auVar30._0_4_ + (float)local_b8._0_4_);
              auVar25._8_4_ = auVar30._8_4_ + fStack_b0;
              auVar46._0_4_ = auVar47._0_4_ + auVar36._0_4_;
              auVar46._4_4_ = auVar47._4_4_ + auVar36._4_4_;
              auVar46._8_4_ = auVar47._8_4_ + auVar36._8_4_;
              auVar47._12_4_ = auVar47._12_4_ + auVar36._12_4_;
              auVar47._0_12_ = auVar46;
              auVar34._0_8_ = CONCAT44(auVar36._4_4_ + auVar43._4_4_,auVar36._0_4_ + auVar43._0_4_);
              auVar34._8_4_ = auVar36._8_4_ + auVar43._8_4_;
              sVar12 = sVar12 + 1;
              auVar43._8_4_ = auVar34._8_4_;
              auVar43._0_8_ = auVar34._0_8_;
              auVar43._12_4_ = auVar36._12_4_ + fVar22;
              auVar55._8_4_ = auVar25._8_4_;
              auVar55._0_8_ = auVar25._0_8_;
              auVar55._12_4_ = auVar30._12_4_ + fStack_ac;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
          }
          else {
            auVar25._8_4_ = auVar55._8_4_;
            auVar25._0_8_ = auVar55._0_8_;
            auVar34._8_4_ = auVar43._8_4_;
            auVar34._0_8_ = auVar43._0_8_;
          }
        }
        fVar45 = (float)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar8 = (ulong)(uint)fVar45;
        aVar48.m128[3] = (float)uVar16;
        aVar48._0_12_ = auVar46;
        aVar31.m128[3] = fVar45;
        aVar31._0_12_ = auVar25;
        aVar37.m128[3] = fVar45;
        aVar37._0_12_ = auVar34;
        auVar41._0_4_ =
             auVar46._0_4_ * 0.5 + auVar34._0_4_ * 0.5 + fVar51 * 0.5 + auVar25._0_4_ * 0.5;
        auVar41._4_4_ =
             auVar46._4_4_ * 0.5 + auVar34._4_4_ * 0.5 + fVar52 * 0.5 + auVar25._4_4_ * 0.5;
        auVar41._8_4_ =
             auVar46._8_4_ * 0.5 + auVar34._8_4_ * 0.5 + fVar53 * 0.5 + auVar25._8_4_ * 0.5;
        auVar41._12_4_ = (float)uVar16 * 0.5 + fVar45 * 0.5 + (float)geomID * 0.5 + fVar45 * 0.5;
        BVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        fVar45 = BVar3.lower;
        fVar23 = BVar3.upper;
        auVar7._4_4_ = fVar52;
        auVar7._0_4_ = fVar51;
        auVar7._8_4_ = fVar53;
        auVar7._12_4_ = geomID;
        aVar44.m128 = (__m128)minps(aVar44.m128,auVar7);
        local_1b0 = local_1b0 + 1;
        local_1a8 = local_1a8 + uVar8;
        bVar20 = local_1d0 < uVar8;
        if (local_1d0 <= uVar8) {
          local_1d0 = uVar8;
        }
        pPVar6 = prims->items;
        pPVar2 = pPVar6 + local_1a0;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[0] = fVar51;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[1] = fVar52;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[2] = fVar53;
        (pPVar2->lbounds).bounds0.lower.field_0.m128[3] = (float)geomID;
        local_198.m128 = (__m128)maxps(local_198.m128,aVar48.m128);
        pPVar6[local_1a0].lbounds.bounds0.upper.field_0 = aVar48;
        aVar57.m128 = (__m128)minps(aVar57.m128,aVar31.m128);
        pPVar6[local_1a0].lbounds.bounds1.lower.field_0 = aVar31;
        aVar56.m128 = (__m128)maxps(aVar56.m128,aVar37.m128);
        pPVar6[local_1a0].lbounds.bounds1.upper.field_0 = aVar37;
        pPVar6[local_1a0].time_range = BVar3;
        aVar42.m128 = (__m128)minps(aVar42.m128,auVar41);
        aVar49.m128 = (__m128)maxps(aVar49.m128,auVar41);
        if (fVar45 <= fVar50) {
          fVar50 = fVar45;
        }
        fVar24 = fVar23;
        if (fVar23 <= fVar58) {
          fVar24 = fVar58;
        }
        uVar17 = (int)((uint)bVar20 << 0x1f) >> 0x1f;
        uVar38 = (int)((uint)bVar20 << 0x1f) >> 0x1f;
        fVar33 = (float)(~uVar17 & (uint)fVar33 | (uint)fVar45 & uVar17);
        fVar39 = (float)(~uVar38 & (uint)fVar39 | (uint)fVar23 & uVar38);
        local_1a0 = local_1a0 + 1;
        uVar8 = r->_end;
        fVar58 = fVar24;
      }
LAB_009d408a:
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar8);
    (__return_storage_ptr__->object_range)._end = local_1b0;
  }
  else {
    fVar33 = 0.0;
    fVar39 = 1.0;
    fVar50 = 1.0;
    fVar58 = 0.0;
    local_1d0 = 0;
    local_1a8 = 0;
    local_198 = _DAT_01f7aa00;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar44;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_198;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar57;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar56;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar42;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar49;
  (__return_storage_ptr__->time_range).lower = fVar50;
  (__return_storage_ptr__->time_range).upper = fVar58;
  __return_storage_ptr__->num_time_segments = local_1a8;
  __return_storage_ptr__->max_num_time_segments = local_1d0;
  (__return_storage_ptr__->max_time_range).lower = fVar33;
  (__return_storage_ptr__->max_time_range).upper = fVar39;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }